

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdManifoldMesh.cpp
# Opt level: O2

bool __thiscall HACD::TMMesh::SaveVRML2(TMMesh *this,ofstream *fout,Material *material)

{
  size_t sVar1;
  CircularListElement<HACD::TMMVertex> *pCVar2;
  char cVar3;
  ostream *poVar4;
  size_t v;
  size_t sVar5;
  size_t sVar6;
  bool bVar7;
  
  cVar3 = std::__basic_file<char>::is_open();
  if (cVar3 != '\0') {
    sVar1 = (this->m_vertices).m_size;
    sVar6 = (this->m_triangles).m_size;
    poVar4 = std::operator<<((ostream *)fout,"#VRML V2.0 utf8");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)fout,"");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)fout,"# Vertices: ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)fout,"# Triangles: ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)fout,"");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)fout,"Group {");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)fout,"\tchildren [");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)fout,"\t\tShape {");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)fout,"\t\t\tappearance Appearance {");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)fout,"\t\t\t\tmaterial Material {");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::operator<<((ostream *)fout,"\t\t\t\t\tdiffuseColor ");
    poVar4 = std::ostream::_M_insert<double>((material->m_diffuseColor).m_data[0]);
    std::operator<<(poVar4," ");
    poVar4 = std::ostream::_M_insert<double>((material->m_diffuseColor).m_data[1]);
    std::operator<<(poVar4," ");
    poVar4 = std::ostream::_M_insert<double>((material->m_diffuseColor).m_data[2]);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::operator<<((ostream *)fout,"\t\t\t\t\tambientIntensity ");
    poVar4 = std::ostream::_M_insert<double>(material->m_ambientIntensity);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::operator<<((ostream *)fout,"\t\t\t\t\tspecularColor ");
    poVar4 = std::ostream::_M_insert<double>((material->m_specularColor).m_data[0]);
    std::operator<<(poVar4," ");
    poVar4 = std::ostream::_M_insert<double>((material->m_specularColor).m_data[1]);
    std::operator<<(poVar4," ");
    poVar4 = std::ostream::_M_insert<double>((material->m_specularColor).m_data[2]);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::operator<<((ostream *)fout,"\t\t\t\t\temissiveColor ");
    poVar4 = std::ostream::_M_insert<double>((material->m_emissiveColor).m_data[0]);
    std::operator<<(poVar4," ");
    poVar4 = std::ostream::_M_insert<double>((material->m_emissiveColor).m_data[1]);
    std::operator<<(poVar4," ");
    poVar4 = std::ostream::_M_insert<double>((material->m_emissiveColor).m_data[2]);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::operator<<((ostream *)fout,"\t\t\t\t\tshininess ");
    poVar4 = std::ostream::_M_insert<double>(material->m_shininess);
    std::endl<char,std::char_traits<char>>(poVar4);
    std::operator<<((ostream *)fout,"\t\t\t\t\ttransparency ");
    poVar4 = std::ostream::_M_insert<double>(material->m_transparency);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)fout,"\t\t\t\t}");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)fout,"\t\t\t}");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)fout,"\t\t\tgeometry IndexedFaceSet {");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)fout,"\t\t\t\tccw TRUE");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)fout,"\t\t\t\tsolid TRUE");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)fout,"\t\t\t\tconvex TRUE");
    std::endl<char,std::char_traits<char>>(poVar4);
    if ((this->m_vertices).m_size != 0) {
      poVar4 = std::operator<<((ostream *)fout,"\t\t\t\tcoord DEF co Coordinate {");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)fout,"\t\t\t\t\tpoint [");
      std::endl<char,std::char_traits<char>>(poVar4);
      for (sVar5 = 0; sVar1 != sVar5; sVar5 = sVar5 + 1) {
        pCVar2 = (this->m_vertices).m_head;
        std::operator<<((ostream *)fout,"\t\t\t\t\t\t");
        poVar4 = std::ostream::_M_insert<double>((pCVar2->m_data).m_pos.m_data[0]);
        std::operator<<(poVar4," ");
        poVar4 = std::ostream::_M_insert<double>((pCVar2->m_data).m_pos.m_data[1]);
        std::operator<<(poVar4," ");
        poVar4 = std::ostream::_M_insert<double>((pCVar2->m_data).m_pos.m_data[2]);
        poVar4 = std::operator<<(poVar4,",");
        std::endl<char,std::char_traits<char>>(poVar4);
        (pCVar2->m_data).m_id = sVar5;
        if ((this->m_vertices).m_size != 0) {
          (this->m_vertices).m_head = ((this->m_vertices).m_head)->m_next;
        }
      }
      poVar4 = std::operator<<((ostream *)fout,"\t\t\t\t\t]");
      std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<((ostream *)fout,"\t\t\t\t}");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    if ((this->m_triangles).m_size != 0) {
      poVar4 = std::operator<<((ostream *)fout,"\t\t\t\tcoordIndex [ ");
      std::endl<char,std::char_traits<char>>(poVar4);
      while (bVar7 = sVar6 != 0, sVar6 = sVar6 - 1, bVar7) {
        poVar4 = std::operator<<((ostream *)fout,"\t\t\t\t\t\t");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,", ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,", -1,");
        std::endl<char,std::char_traits<char>>(poVar4);
        if ((this->m_triangles).m_size != 0) {
          (this->m_triangles).m_head = ((this->m_triangles).m_head)->m_next;
        }
      }
      poVar4 = std::operator<<((ostream *)fout,"\t\t\t\t]");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    poVar4 = std::operator<<((ostream *)fout,"\t\t\t}");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)fout,"\t\t}");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)fout,"\t]");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)fout,"}");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  return true;
}

Assistant:

bool TMMesh::SaveVRML2(std::ofstream &fout, const Material & material)
    {
        if (fout.is_open()) 
        {
            size_t nV = m_vertices.GetSize();
            size_t nT = m_triangles.GetSize();            
            fout <<"#VRML V2.0 utf8" << std::endl;	    	
            fout <<"" << std::endl;
            fout <<"# Vertices: " << nV << std::endl;		
            fout <<"# Triangles: " << nT << std::endl;		
            fout <<"" << std::endl;
            fout <<"Group {" << std::endl;
            fout <<"	children [" << std::endl;
            fout <<"		Shape {" << std::endl;
            fout <<"			appearance Appearance {" << std::endl;
            fout <<"				material Material {" << std::endl;
            fout <<"					diffuseColor "      << material.m_diffuseColor.X()      << " " 
                                                            << material.m_diffuseColor.Y()      << " "
                                                            << material.m_diffuseColor.Z()      << std::endl;  
            fout <<"					ambientIntensity "  << material.m_ambientIntensity      << std::endl;
            fout <<"					specularColor "     << material.m_specularColor.X()     << " " 
                                                            << material.m_specularColor.Y()     << " "
                                                            << material.m_specularColor.Z()     << std::endl; 
            fout <<"					emissiveColor "     << material.m_emissiveColor.X()     << " " 
                                                            << material.m_emissiveColor.Y()     << " "
                                                            << material.m_emissiveColor.Z()     << std::endl; 
            fout <<"					shininess "         << material.m_shininess             << std::endl;
            fout <<"					transparency "      << material.m_transparency          << std::endl;
            fout <<"				}" << std::endl;
            fout <<"			}" << std::endl;
            fout <<"			geometry IndexedFaceSet {" << std::endl;
            fout <<"				ccw TRUE" << std::endl;
            fout <<"				solid TRUE" << std::endl;
            fout <<"				convex TRUE" << std::endl;
            if (GetNVertices() > 0) {
                fout <<"				coord DEF co Coordinate {" << std::endl;
                fout <<"					point [" << std::endl;
                for(size_t v = 0; v < nV; v++)
                {
                    TMMVertex & currentVertex = m_vertices.GetData();
                    fout <<"						" << currentVertex.m_pos.X() << " " 
                                                      << currentVertex.m_pos.Y() << " " 
                                                      << currentVertex.m_pos.Z() << "," << std::endl;
                    currentVertex.m_id = v;
                    m_vertices.Next();
                }
                fout <<"					]" << std::endl;
                fout <<"				}" << std::endl;
            }
            if (GetNTriangles() > 0) {
                fout <<"				coordIndex [ " << std::endl;
                for(size_t f = 0; f < nT; f++)
                {
                    TMMTriangle & currentTriangle = m_triangles.GetData();
                    fout <<"						" << currentTriangle.m_vertices[0]->GetData().m_id << ", " 
                                                      << currentTriangle.m_vertices[1]->GetData().m_id << ", "                                                  
                                                      << currentTriangle.m_vertices[2]->GetData().m_id << ", -1," << std::endl;
                    m_triangles.Next();
                }
                fout <<"				]" << std::endl;
            }
            fout <<"			}" << std::endl;
            fout <<"		}" << std::endl;
            fout <<"	]" << std::endl;
            fout <<"}" << std::endl;	
        }
        return true;
    }